

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_3::DBIter::status(DBIter *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  
  if (*(long *)(in_RSI + 0x48) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_00a470f4;
    (**(code **)(**(long **)(in_RSI + 0x38) + 0x50))(this);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_00a470f4:
      __stack_chk_fail();
    }
    Status::Status((Status *)this,(Status *)(in_RSI + 0x48));
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    if (status_.ok()) {
      return iter_->status();
    } else {
      return status_;
    }
  }